

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Operation<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<duckdb::string_t,_int> *state,string_t *x,int *y,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  AggregateBinaryInput *in_R9;
  string_t x_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    x_data.value._8_4_ = *y;
    x_data.value._0_8_ = (x->value).pointer.ptr;
    x_data.value._12_4_ = 0;
    Execute<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>>
              ((ArgMinMaxBase<duckdb::GreaterThan,false> *)state,
               *(ArgMinMaxState<duckdb::string_t,_int> **)&x->value,x_data,(int)binary,in_R9);
    return;
  }
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    Assign<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>>(state,x,y,!bVar1);
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}